

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_expr_t * gs_parse_expr_comparison(gs_parser_t *parser)

{
  gs_token_t token_00;
  gs_token_t token_01;
  gs_token_t token_02;
  gs_token_t token_03;
  gs_token_t token_04;
  _Bool _Var1;
  gs_expr_t *pgVar2;
  gs_expr_t *right_4;
  gs_expr_t *right_3;
  gs_expr_t *right_2;
  gs_expr_t *right_1;
  gs_expr_t *right;
  gs_expr_t *expr;
  gs_token_t token;
  gs_parser_t *parser_local;
  
  token.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)parser;
  gs_peek((gs_token_t *)&expr,parser);
  right = gs_parse_expr_term((gs_parser_t *)token.field_3.symbol);
  if ((token.field_3.symbol[0x1c] & 1U) == 0) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (_Var1 = gs_eat_char_n((gs_parser_t *)token.field_3.symbol,2,0x3d), _Var1) {
              pgVar2 = gs_parse_expr_comparison((gs_parser_t *)token.field_3.symbol);
              if ((token.field_3.symbol[0x1c] & 1U) != 0) {
                return right;
              }
              token_00.col = token.type;
              token_00._12_4_ = token.line;
              token_00._0_8_ = expr;
              token_00.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
              right = gs_expr_binary_op_new
                                ((gs_parser_t *)token.field_3.symbol,token_00,GS_BINARY_OP_EQ,right,
                                 pgVar2);
            }
            _Var1 = gs_eat_char_n((gs_parser_t *)token.field_3.symbol,2,0x3c,0x3d);
            if (!_Var1) break;
            pgVar2 = gs_parse_expr_comparison((gs_parser_t *)token.field_3.symbol);
            if ((token.field_3.symbol[0x1c] & 1U) != 0) {
              return right;
            }
            token_01.col = token.type;
            token_01._12_4_ = token.line;
            token_01._0_8_ = expr;
            token_01.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
            right = gs_expr_binary_op_new
                              ((gs_parser_t *)token.field_3.symbol,token_01,GS_BINARY_OP_LTE,right,
                               pgVar2);
          }
          _Var1 = gs_eat_char_n((gs_parser_t *)token.field_3.symbol,2,0x3e,0x3d);
          if (!_Var1) break;
          pgVar2 = gs_parse_expr_comparison((gs_parser_t *)token.field_3.symbol);
          if ((token.field_3.symbol[0x1c] & 1U) != 0) {
            return right;
          }
          token_02.col = token.type;
          token_02._12_4_ = token.line;
          token_02._0_8_ = expr;
          token_02.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
          right = gs_expr_binary_op_new
                            ((gs_parser_t *)token.field_3.symbol,token_02,GS_BINARY_OP_GTE,right,
                             pgVar2);
        }
        _Var1 = gs_eat_char((gs_parser_t *)token.field_3.symbol,'>');
        if (!_Var1) break;
        pgVar2 = gs_parse_expr_comparison((gs_parser_t *)token.field_3.symbol);
        if ((token.field_3.symbol[0x1c] & 1U) != 0) {
          return right;
        }
        token_03.col = token.type;
        token_03._12_4_ = token.line;
        token_03._0_8_ = expr;
        token_03.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
        right = gs_expr_binary_op_new
                          ((gs_parser_t *)token.field_3.symbol,token_03,GS_BINARY_OP_GT,right,pgVar2
                          );
      }
      _Var1 = gs_eat_char((gs_parser_t *)token.field_3.symbol,'<');
      if ((!_Var1) ||
         (pgVar2 = gs_parse_expr_comparison((gs_parser_t *)token.field_3.symbol),
         (token.field_3.symbol[0x1c] & 1U) != 0)) break;
      token_04.col = token.type;
      token_04._12_4_ = token.line;
      token_04._0_8_ = expr;
      token_04.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
      right = gs_expr_binary_op_new
                        ((gs_parser_t *)token.field_3.symbol,token_04,GS_BINARY_OP_LT,right,pgVar2);
    }
  }
  return right;
}

Assistant:

static gs_expr_t *gs_parse_expr_comparison(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_term(parser);
    if (parser->error) goto cleanup;

    while (true) {
        if (gs_eat_char_n(parser, 2, '=', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_EQ, expr, right);
        }
        else if (gs_eat_char_n(parser, 2, '<', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_LTE, expr, right);
        }
        else if (gs_eat_char_n(parser, 2, '>', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_GTE, expr, right);
        }
        else if (gs_eat_char(parser, '>')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_GT, expr, right);
        }
        else if (gs_eat_char(parser, '<')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_LT, expr, right);
        }
        else {
            break;
        }
    }

cleanup:
    return expr;
}